

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O2

int64_t decNumberIntegralToInt64(decNumber_conflict *dn,decContext *set)

{
  int iVar1;
  uint16_t *puVar2;
  long lVar3;
  uint64_t prev;
  ulong uVar4;
  ulong uVar5;
  
  if ((dn->bits & 0x70) == 0) {
    iVar1 = dn->exponent;
    if ((-1 < (long)iVar1) && (dn->digits + iVar1 < 0x14)) {
      puVar2 = dn->lsu;
      uVar4 = 0;
      for (lVar3 = 1; lVar3 <= dn->digits; lVar3 = lVar3 + 3) {
        uVar5 = (ulong)*puVar2 * *(long *)(&UNK_00bbcd08 + lVar3 * 8) + uVar4;
        if ((uVar5 < uVar4) || ((long)uVar5 < 0)) goto LAB_009a7962;
        puVar2 = puVar2 + 1;
        uVar4 = uVar5;
      }
      uVar5 = DECPOWERS[iVar1] * uVar4;
      if (-1 < (long)uVar5 && uVar4 <= uVar5) {
        if ((char)dn->bits < '\0') {
          return -uVar5;
        }
        return uVar5;
      }
    }
  }
LAB_009a7962:
  decContextSetStatus(set,0x80);
  return 0;
}

Assistant:

int64_t decNumberIntegralToInt64(const decNumber *dn, decContext *set)
{
    if (decNumberIsSpecial(dn) || (dn->exponent < 0) ||
       (dn->digits + dn->exponent > 19)) {
        goto Invalid;
    } else {
        int64_t d;        /* work */
        const Unit *up;   /* .. */
        uint64_t hi = 0;
        up = dn->lsu;     /* -> lsu */

        for (d = 1; d <= dn->digits; up++, d += DECDPUN) {
            uint64_t prev = hi;
            hi += *up * powers[d-1];
            if ((hi < prev) || (hi > INT64_MAX)) {
                goto Invalid;
            }
        }

        uint64_t prev = hi;
        hi *= (uint64_t)powers[dn->exponent];
        if ((hi < prev) || (hi > INT64_MAX)) {
            goto Invalid;
        }
        return (decNumberIsNegative(dn)) ? -((int64_t)hi) : (int64_t)hi;
    }

Invalid:
    decContextSetStatus(set, DEC_Invalid_operation);
    return 0;
}